

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_argerror(lua_State *L,int narg,char *extramsg)

{
  int iVar1;
  undefined8 in_RDX;
  uint in_ESI;
  lua_State *in_RDI;
  lua_Debug ar;
  char *local_90;
  char *local_88;
  lua_Debug *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  uint local_14;
  int local_4;
  
  iVar1 = lua_getstack(in_RDI,0,(lua_Debug *)&stack0xffffffffffffff68);
  if (iVar1 == 0) {
    local_4 = luaL_error(in_RDI,"bad argument #%d (%s)",(ulong)in_ESI,in_RDX);
  }
  else {
    lua_getinfo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    iVar1 = strcmp(local_88,"method");
    local_14 = in_ESI;
    if ((iVar1 == 0) && (local_14 = in_ESI - 1, local_14 == 0)) {
      local_4 = luaL_error(in_RDI,"calling \'%s\' on bad self (%s)",local_90,in_RDX);
    }
    else {
      if (local_90 == (char *)0x0) {
        local_90 = "?";
      }
      local_4 = luaL_error(in_RDI,"bad argument #%d to \'%s\' (%s)",(ulong)local_14,local_90,in_RDX)
      ;
    }
  }
  return local_4;
}

Assistant:

static int luaL_argerror(lua_State*L,int narg,const char*extramsg){
lua_Debug ar;
if(!lua_getstack(L,0,&ar))
return luaL_error(L,"bad argument #%d (%s)",narg,extramsg);
lua_getinfo(L,"n",&ar);
if(strcmp(ar.namewhat,"method")==0){
narg--;
if(narg==0)
return luaL_error(L,"calling "LUA_QL("%s")" on bad self (%s)",
ar.name,extramsg);
}
if(ar.name==NULL)
ar.name="?";
return luaL_error(L,"bad argument #%d to "LUA_QL("%s")" (%s)",
narg,ar.name,extramsg);
}